

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void __thiscall
NavierStokesBase::checkPoint(NavierStokesBase *this,string *dir,ostream *os,How how,bool dump_old)

{
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  _Ios_Openmode __a;
  string *file;
  char *pcVar4;
  double *pdVar5;
  ostream *poVar6;
  byte in_R8B;
  string TAFileName;
  ofstream TImeAverageFile;
  IO_Buffer io_buffer;
  size_type in_stack_fffffffffffffd38;
  Vector<char,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_270 [32];
  long local_250 [25];
  bool in_stack_fffffffffffffe7b;
  How in_stack_fffffffffffffe7c;
  ostream *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffe88;
  AmrLevel *in_stack_fffffffffffffe90;
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_38.field_2._M_local_buf[0xb] = in_R8B & 1;
  amrex::AmrLevel::checkPoint
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
             in_stack_fffffffffffffe7c,in_stack_fffffffffffffe7b);
  if (0 < avg_interval) {
    std::allocator<char>::allocator();
    amrex::Vector<char,_std::allocator<char>_>::vector
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,(allocator_type *)0x7b5c2e);
    std::allocator<char>::~allocator(&local_39);
    bVar1 = amrex::ParallelDescriptor::IOProcessor();
    if (bVar1) {
      std::ofstream::ofstream(local_250);
      file = (string *)std::ofstream::rdbuf();
      __lhs = &local_38;
      pcVar4 = amrex::Vector<char,_std::allocator<char>_>::dataPtr
                         ((Vector<char,_std::allocator<char>_> *)0x7b5c7a);
      amrex::Vector<char,_std::allocator<char>_>::size
                ((Vector<char,_std::allocator<char>_> *)0x7b5c89);
      std::streambuf::pubsetbuf((char *)file,(long)pcVar4);
      std::operator+(__lhs,(char *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      _Var3 = std::__cxx11::string::c_str();
      __a = std::operator|(_S_out,_S_trunc);
      std::operator|(__a,_S_bin);
      std::ofstream::open((char *)local_250,_Var3);
      bVar2 = std::ios::good();
      if ((bVar2 & 1) == 0) {
        amrex::FileOpenFailed(file);
      }
      std::ios_base::precision((ios_base *)((long)local_250 + *(long *)(local_250[0] + -0x18)),0x11)
      ;
      std::operator<<((ostream *)local_250,"Writing time_average to checkpoint\n");
      pdVar5 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd40,
                          in_stack_fffffffffffffd38);
      poVar6 = (ostream *)std::ostream::operator<<(local_250,*pdVar5);
      std::operator<<(poVar6,"\n");
      pdVar5 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd40,
                          in_stack_fffffffffffffd38);
      poVar6 = (ostream *)std::ostream::operator<<(local_250,*pdVar5);
      std::operator<<(poVar6,"\n");
      std::__cxx11::string::~string(local_270);
      std::ofstream::~ofstream(local_250);
    }
    amrex::Vector<char,_std::allocator<char>_>::~Vector
              ((Vector<char,_std::allocator<char>_> *)0x7b5e8b);
  }
  return;
}

Assistant:

void
NavierStokesBase::checkPoint (const std::string& dir,
			      std::ostream&      os,
			      VisMF::How         how,
			      bool               dump_old)
{
    AmrLevel::checkPoint(dir, os, how, dump_old);

    if (avg_interval > 0)
    {
        VisMF::IO_Buffer io_buffer(VisMF::IO_Buffer_Size);

        if (ParallelDescriptor::IOProcessor())
        {
            std::ofstream TImeAverageFile;
            TImeAverageFile.rdbuf()->pubsetbuf(io_buffer.dataPtr(), io_buffer.size());
            std::string TAFileName(dir + "/TimeAverage");
            TImeAverageFile.open(TAFileName.c_str(), std::ofstream::out |
                                 std::ofstream::trunc |
                                 std::ofstream::binary);

            if( !TImeAverageFile.good()) {
                amrex::FileOpenFailed(TAFileName);
            }

            TImeAverageFile.precision(17);

            // write out title line
            TImeAverageFile << "Writing time_average to checkpoint\n";

            TImeAverageFile << NavierStokesBase::time_avg[level] << "\n";
            TImeAverageFile << NavierStokesBase::time_avg_fluct[level] << "\n";
        }
    }

#ifdef AMREX_PARTICLES
    if (level == 0)
    {
        if (NSPC != 0)
            NSPC->Checkpoint(dir,the_ns_particle_file_name);
    }
#endif
}